

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O2

void __thiscall FMD3Model::LoadGeometry(FMD3Model *this)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  MD3Surface *pMVar6;
  undefined1 auVar7 [16];
  char *pcVar8;
  MD3Triangle *pMVar9;
  MD3TexCoord *pMVar10;
  MD3Vertex *pMVar11;
  char *pcVar12;
  int i;
  long lVar13;
  ulong uVar14;
  int j;
  long lVar15;
  MD3Surface *pMVar16;
  char *pcVar17;
  float *pfVar18;
  ulong uVar19;
  char *pcVar20;
  undefined1 auVar21 [16];
  FMemLump lumpdata;
  DWORD *local_50;
  DWORD *local_48;
  double local_40;
  double local_38;
  
  FWadCollection::ReadLump((FWadCollection *)&lumpdata,0xa07390);
  if (*(int *)((long)lumpdata.Block.Chars + -0xc) == 0) {
    lumpdata.Block.Chars = (FString)(FString)(char *)0x0;
  }
  pMVar6 = this->surfaces;
  pcVar8 = (char *)(ulong)(uint)this->numSurfaces;
  if (this->numSurfaces < 1) {
    pcVar8 = (char *)0x0;
  }
  iVar2 = this->numFrames;
  pcVar20 = (char *)((long)lumpdata.Block.Chars + (ulong)*(uint *)((long)lumpdata.Block.Chars + 100)
                    );
  for (pcVar12 = (char *)0x0; pcVar12 != pcVar8; pcVar12 = pcVar12 + 1) {
    uVar3 = *(uint *)(pcVar20 + 0x58);
    uVar19 = (ulong)pMVar6[(long)pcVar12].numTriangles;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar19;
    uVar4 = *(uint *)(pcVar20 + 0x68);
    uVar14 = SUB168(auVar21 * ZEXT816(0xc),0);
    if (SUB168(auVar21 * ZEXT816(0xc),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pMVar9 = (MD3Triangle *)operator_new__(uVar14);
    pMVar16 = pMVar6 + (long)pcVar12;
    pcVar17 = pcVar20 + uVar3;
    pMVar16->tris = pMVar9;
    for (lVar13 = 0; lVar13 < (long)uVar19; lVar13 = lVar13 + 1) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        pMVar9->VertIndex[lVar15] = *(int *)(pcVar17 + lVar15 * 4);
      }
      pMVar9 = pMVar9 + 1;
      pcVar17 = pcVar17 + 0xc;
    }
    uVar3 = *(uint *)(pcVar20 + 0x60);
    uVar5 = pMVar16->numVertices;
    lVar13 = (long)(int)uVar5;
    uVar14 = lVar13 * 8;
    if (lVar13 < 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pMVar10 = (MD3TexCoord *)operator_new__(uVar14);
    pMVar16->texcoords = pMVar10;
    uVar14 = 0;
    if (0 < (int)uVar5) {
      uVar14 = (ulong)uVar5;
    }
    for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      pMVar10[uVar19] = *(MD3TexCoord *)(pcVar20 + uVar19 * 8 + (ulong)uVar3);
    }
    uVar19 = lVar13 * iVar2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar19;
    uVar3 = *(uint *)(pcVar20 + 100);
    uVar14 = SUB168(auVar7 * ZEXT816(0x18),0);
    if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pMVar11 = (MD3Vertex *)operator_new__(uVar14);
    uVar14 = uVar19 & 0xffffffff;
    if ((int)uVar19 < 1) {
      uVar14 = 0;
    }
    pMVar16->vertices = pMVar11;
    pfVar18 = &pMVar11->nz;
    for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      auVar21 = pshuflw(ZEXT416(*(uint *)(pcVar20 + uVar19 * 8 + (ulong)uVar3)),
                        ZEXT416(*(uint *)(pcVar20 + uVar19 * 8 + (ulong)uVar3)),0x60);
      ((MD3Vertex *)(pfVar18 + -5))->x = (float)(auVar21._0_4_ >> 0x10) * 0.015625;
      ((MD3Vertex *)(pfVar18 + -5))->y = (float)(auVar21._4_4_ >> 0x10) * 0.015625;
      pfVar18[-3] = (float)(int)*(short *)(pcVar20 + uVar19 * 8 + (ulong)uVar3 + 4) * 0.015625;
      uVar1 = *(ushort *)(pcVar20 + uVar19 * 8 + (ulong)uVar3 + 6);
      sincos((double)(uVar1 >> 8) * 0.02454369260617026,&local_38,&local_40);
      sincos((double)(byte)uVar1 * 0.02454369260617026,(double *)&local_48,(double *)&local_50);
      *(ulong *)(pfVar18 + -2) =
           CONCAT44((float)((double)local_48 * local_38),(float)((double)local_48 * local_40));
      *pfVar18 = (float)(double)local_50;
      pfVar18 = pfVar18 + 6;
    }
    pcVar20 = pcVar20 + uVar4;
  }
  FMemLump::~FMemLump(&lumpdata);
  return;
}

Assistant:

void FMD3Model::LoadGeometry()
{
	FMemLump lumpdata = Wads.ReadLump(mLumpNum);
	const char *buffer = (const char *)lumpdata.GetMem();
	md3_header_t * hdr = (md3_header_t *)buffer;
	md3_surface_t * surf = (md3_surface_t*)(buffer + LittleLong(hdr->Ofs_Surfaces));

	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * s = &surfaces[i];
		md3_surface_t * ss = surf;

		surf = (md3_surface_t *)(((char*)surf) + LittleLong(surf->Ofs_End));

		// copy triangle indices
		md3_triangle_t * tris = (md3_triangle_t*)(((char*)ss)+LittleLong(ss->Ofs_Triangles));
		s->tris = new MD3Triangle[s->numTriangles];

		for(int i=0;i<s->numTriangles;i++) for (int j=0;j<3;j++)
		{
			s->tris[i].VertIndex[j]=LittleLong(tris[i].vt_index[j]);
		}

		// Load texture coordinates
		md3_texcoord_t * tc = (md3_texcoord_t*)(((char*)ss)+LittleLong(ss->Ofs_Texcoord));
		s->texcoords = new MD3TexCoord[s->numVertices];

		for(int i=0;i<s->numVertices;i++)
		{
			s->texcoords[i].s = tc[i].s;
			s->texcoords[i].t = tc[i].t;
		}

		// Load vertices and texture coordinates
		md3_vertex_t * vt = (md3_vertex_t*)(((char*)ss)+LittleLong(ss->Ofs_XYZNormal));
		s->vertices = new MD3Vertex[s->numVertices * numFrames];

		for(int i=0;i<s->numVertices * numFrames;i++)
		{
			s->vertices[i].x = LittleShort(vt[i].x)/64.f;
			s->vertices[i].y = LittleShort(vt[i].y)/64.f;
			s->vertices[i].z = LittleShort(vt[i].z)/64.f;
			UnpackVector( LittleShort(vt[i].n), s->vertices[i].nx, s->vertices[i].ny, s->vertices[i].nz);
		}
	}
}